

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-parser.cc
# Opt level: O0

void __thiscall GenParser::visit(GenParser *this,Plus *node)

{
  Temp *pTVar1;
  IRBuilder *this_00;
  string local_58;
  Temp *local_38;
  Temp *target;
  BasicBlock *iffalse;
  BasicBlock *iftrue;
  BasicBlock *more;
  Plus *node_local;
  GenParser *this_local;
  
  this_00 = &this->super_IRBuilder;
  more = (BasicBlock *)node;
  node_local = (Plus *)this;
  iftrue = IR::IRBuilder::newBasicBlock(this_00);
  iffalse = IR::IRBuilder::newBasicBlock(this_00);
  target = (Temp *)IR::IRBuilder::newBasicBlock(this_00);
  std::__cxx11::string::string((string *)&local_58);
  pTVar1 = IR::IRBuilder::newTemp(this_00,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  local_38 = pTVar1;
  CodeGenerator::condition
            (&this->super_CodeGenerator,
             (Node *)(more->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
                     super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,iftrue,
             (this->super_CodeGenerator).code.iffalse);
  IR::IRBuilder::place(&this->super_IRBuilder,iftrue);
  IR::IRBuilder::jump(&this->super_IRBuilder,iffalse);
  IR::IRBuilder::place(&this->super_IRBuilder,iffalse);
  IR::IRBuilder::save(&this->super_IRBuilder,local_38);
  CodeGenerator::condition
            (&this->super_CodeGenerator,
             (Node *)(more->super_vector<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>).
                     super__Vector_base<IR::Stmt_*,_std::allocator<IR::Stmt_*>_>._M_impl.
                     super__Vector_impl_data._M_finish,iffalse,(BasicBlock *)target);
  IR::IRBuilder::place(&this->super_IRBuilder,(BasicBlock *)target);
  IR::IRBuilder::restore(&this->super_IRBuilder,local_38);
  IR::IRBuilder::jump(&this->super_IRBuilder,(this->super_CodeGenerator).code.iftrue);
  return;
}

Assistant:

void GenParser::visit(ast::Plus* node) {
  auto more = newBasicBlock();
  auto iftrue = newBasicBlock();
  auto iffalse = newBasicBlock();
  auto target = newTemp();

  condition(node->item, more, code.iffalse);
  place(more);
  jump(iftrue);
  place(iftrue);
  save(target);
  condition(node->item, iftrue, iffalse);
  place(iffalse);
  restore(target);
  jump(code.iftrue);
}